

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall
efsw::DirWatcherGeneric::handleAction
          (DirWatcherGeneric *this,string *filename,unsigned_long action,string *oldFilename)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  string *psVar3;
  string local_98 [48];
  string local_68 [32];
  FileSystem local_48 [32];
  string *local_28;
  string *oldFilename_local;
  unsigned_long action_local;
  string *filename_local;
  DirWatcherGeneric *this_local;
  
  WVar1 = (this->Watch->super_Watcher).ID;
  pFVar2 = (this->Watch->super_Watcher).Listener;
  local_28 = oldFilename;
  oldFilename_local = (string *)action;
  action_local = (unsigned_long)filename;
  filename_local = (string *)this;
  std::__cxx11::string::string(local_68,(string *)filename);
  FileSystem::fileNameFromPath(local_48,(string *)local_68);
  psVar3 = oldFilename_local;
  std::__cxx11::string::string(local_98,(string *)oldFilename);
  (*pFVar2->_vptr_FileWatchListener[2])
            (pFVar2,WVar1,&this->DirSnap,local_48,(ulong)psVar3 & 0xffffffff,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void DirWatcherGeneric::handleAction( const std::string& filename, unsigned long action,
									  std::string oldFilename ) {
	Watch->Listener->handleFileAction( Watch->ID, DirSnap.DirectoryInfo.Filepath,
									   FileSystem::fileNameFromPath( filename ), (Action)action,
									   oldFilename );
}